

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

xmlChar * xmlParseSGMLCatalogPubid(xmlChar *cur,xmlChar **id)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  xmlChar *pxVar4;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  xmlChar *pxVar10;
  bool bVar11;
  
  *id = (xmlChar *)0x0;
  if (*cur == '\'') {
    bVar7 = 0x27;
LAB_00165b8c:
    cur = cur + 1;
    bVar1 = 1;
    bVar2 = false;
  }
  else {
    if (*cur == '\"') {
      bVar7 = 0x22;
      goto LAB_00165b8c;
    }
    bVar1 = 0;
    bVar7 = 0x20;
    bVar2 = true;
  }
  pxVar4 = (xmlChar *)(*xmlMalloc)(0x32);
  if (pxVar4 == (xmlChar *)0x0) {
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x14,
                        (xmlError *)0x0);
    return (xmlChar *)0x0;
  }
  bVar6 = *cur;
  uVar5 = (ulong)bVar6;
  if ((bool)(bVar7 == bVar6 & bVar1) || ""[uVar5] == '\0' && bVar6 != 0x3f) {
    uVar5 = 0;
  }
  else {
    uVar8 = 0x32;
    uVar9 = 0;
    pxVar10 = pxVar4;
    do {
      bVar6 = (byte)uVar5;
      if (((bVar2) && (bVar6 < 0x21)) && ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0)) {
        pxVar10[uVar9 & 0xffffffff] = '\0';
        cur = cur + uVar9;
        goto LAB_00165d07;
      }
      pxVar4 = pxVar10;
      if ((int)uVar8 <= (int)uVar9 + 1) {
        if ((int)uVar8 < 1) {
          uVar8 = 1;
        }
        else {
          if (999999999 < uVar8) goto LAB_00165d35;
          uVar3 = uVar8 + 1 >> 1;
          bVar11 = 1000000000 - uVar3 < uVar8;
          uVar8 = uVar3 + uVar8;
          if (bVar11) {
            uVar8 = 1000000000;
          }
        }
        pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar10,(ulong)uVar8);
        if (pxVar4 == (xmlChar *)0x0) {
LAB_00165d35:
          xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x14,
                              (xmlError *)0x0);
          (*xmlFree)(pxVar10);
          return (xmlChar *)0x0;
        }
        bVar6 = cur[uVar9];
      }
      pxVar4[uVar9] = bVar6;
      bVar6 = cur[uVar9 + 1];
      uVar5 = (ulong)bVar6;
      uVar9 = uVar9 + 1;
    } while ((bVar6 == 0x3f || ""[uVar5] != '\0') &&
            (pxVar10 = pxVar4, !(bool)(bVar7 == bVar6 & bVar1)));
    uVar5 = uVar9 & 0xffffffff;
    cur = cur + uVar9;
  }
  pxVar4[uVar5] = '\0';
  pxVar10 = pxVar4;
  if (bVar2) {
LAB_00165d07:
    if ((0x20 < (ulong)*cur) || ((0x100002600U >> ((ulong)*cur & 0x3f) & 1) == 0))
    goto LAB_00165d25;
  }
  else {
    if (bVar7 != *cur) {
LAB_00165d25:
      (*xmlFree)(pxVar10);
      return (xmlChar *)0x0;
    }
    cur = cur + 1;
  }
  *id = pxVar10;
  return cur;
}

Assistant:

static const xmlChar *
xmlParseSGMLCatalogPubid(const xmlChar *cur, xmlChar **id) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = 50;
    xmlChar stop;

    *id = NULL;

    if (RAW == '"') {
        NEXT;
	stop = '"';
    } else if (RAW == '\'') {
        NEXT;
	stop = '\'';
    } else {
	stop = ' ';
    }
    buf = xmlMalloc(size);
    if (buf == NULL) {
        xmlCatalogErrMemory();
	return(NULL);
    }
    while (IS_PUBIDCHAR_CH(*cur) || (*cur == '?')) {
	if ((*cur == stop) && (stop != ' '))
	    break;
	if ((stop == ' ') && (IS_BLANK_CH(*cur)))
	    break;
	if (len + 1 >= size) {
            xmlChar *tmp;
            int newSize;

            newSize = xmlGrowCapacity(size, 1, 1, XML_MAX_ITEMS);
            if (newSize < 0) {
		xmlCatalogErrMemory();
		xmlFree(buf);
		return(NULL);
            }
	    tmp = xmlRealloc(buf, newSize);
	    if (tmp == NULL) {
		xmlCatalogErrMemory();
		xmlFree(buf);
		return(NULL);
	    }
	    buf = tmp;
            size = newSize;
	}
	buf[len++] = *cur;
	NEXT;
    }
    buf[len] = 0;
    if (stop == ' ') {
	if (!IS_BLANK_CH(*cur)) {
	    xmlFree(buf);
	    return(NULL);
	}
    } else {
	if (*cur != stop) {
	    xmlFree(buf);
	    return(NULL);
	}
	NEXT;
    }
    *id = buf;
    return(cur);
}